

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char16_t * openjtalk_getFullVoicePathU16(OpenJTalk *oj,char16_t *path,char16_t *buffer)

{
  long lVar1;
  char *pcVar2;
  char16_t *pcVar3;
  char temp [260];
  char acStack_118 [264];
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if ((path != (char16_t *)0x0) && (*path != 0)) {
      lVar1 = 1;
      do {
        pcVar3 = path + lVar1;
        lVar1 = lVar1 + 1;
      } while (*pcVar3 != 0);
      if (lVar1 != 1) {
        if (buffer == (char16_t *)0x0) {
          oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
          return (char16_t *)0x0;
        }
        pcVar2 = convert_charset_path((char *)path,CS_UTF_16LE,acStack_118,CS_UTF_8);
        if (pcVar2 == (char *)0x0) {
          return (char16_t *)0x0;
        }
        pcVar2 = make_voice_path(oj,acStack_118);
        if (pcVar2 == (char *)0x0) {
          return (char16_t *)0x0;
        }
        pcVar3 = (char16_t *)convert_charset_path(pcVar2,CS_UTF_8,(char *)buffer,CS_UTF_16LE);
        free(pcVar2);
        return pcVar3;
      }
    }
    oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
  }
  return (char16_t *)0x0;
}

Assistant:

OPENJTALK_DLL_API char16_t *OPENJTALK_CONVENTION openjtalk_getFullVoicePathU16(OpenJTalk *oj, const char16_t *path, char16_t *buffer)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!path || strlenU16(path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return NULL;
	}

	if (!buffer)
	{
		oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
		return NULL;
	}

	char temp[MAX_PATH];
#if defined(_WIN32)
	char *res = u16tou8_path(path, temp);
#else
	char *res = u16tou8_path(path, temp);
#endif

	if (!res)
	{
		return NULL;
	}

	char *temp2 = make_voice_path(oj, temp);
	if (!temp2)
	{
		return NULL;
	}

#if defined(_WIN32)
	char16_t *res2 = u8tou16_path(temp2, buffer);
#else
	char16_t *res2 = u8tou16_path(temp2, buffer);
#endif
	free(temp2);
	return res2;
}